

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall Array::add(Array *this,int item)

{
  int iVar1;
  reference pvVar2;
  
  iVar1 = this->theSize;
  if (this->totSize <= iVar1) {
    resize(this,(int)((double)this->totSize * 1.5));
    iVar1 = this->theSize;
  }
  pvVar2 = std::vector<int,_std::allocator<int>_>::at
                     ((this->theArray).
                      super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,(long)iVar1);
  *pvVar2 = item;
  this->theSize = this->theSize + 1;
  return;
}

Assistant:

void add(int item) {
        if (theSize + 1 > totSize) {
            resize((int) (totSize * 1.5));
        }
        theArray->at(theSize) = (item);
        theSize++;
    }